

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterial_fourier(SemanticParser *this,SP *in)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined1 auVar7 [16];
  SP SVar8;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  string local_e8;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  SemanticParser *local_b8;
  _Rb_tree_node_base *local_b0;
  long *local_a8;
  string local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = this;
  std::__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::FourierMaterial>,std::__cxx11::string&>
            ((__shared_ptr<pbrt::FourierMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
             (allocator<pbrt::FourierMaterial> *)&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  p_Var6 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var5 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var4._M_pi = extraout_RDX;
  if (p_Var6 != p_Var5) {
    local_b0 = p_Var5;
    local_a8 = in_RDX;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_80,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var6 + 1));
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_80.first._M_dataplus._M_p,
                 local_80.first._M_dataplus._M_p + local_80.first._M_string_length);
      iVar1 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar1 == 0) {
        syntactic::ParamSet::getParamString(&local_e8,(ParamSet *)*local_a8,&local_a0);
        std::__cxx11::string::operator=
                  ((string *)
                   &(local_c8->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(string *)&local_e8);
        p_Var5 = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
          p_Var5 = local_b0;
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar1 != 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"un-handled fourier-material parameter \'",&local_80.first);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_e8._M_dataplus._M_p = (pointer)*plVar2;
          psVar3 = (size_type *)(plVar2 + 2);
          if ((size_type *)local_e8._M_dataplus._M_p == psVar3) {
            local_e8.field_2._M_allocated_capacity = *psVar3;
            local_e8.field_2._8_8_ = plVar2[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar3;
          }
          local_e8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::runtime_error::runtime_error(this_00,(string *)&local_e8);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (local_80.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
        operator_delete(local_80.first._M_dataplus._M_p);
      }
      auVar7 = std::_Rb_tree_increment(p_Var6);
      _Var4._M_pi = auVar7._8_8_;
      p_Var6 = auVar7._0_8_;
    } while (p_Var6 != p_Var5);
  }
  (local_b8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  (local_b8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_c0;
  SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b8;
  return (SP)SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_fourier(pbrt::syntactic::Material::SP in)
  {
    FourierMaterial::SP mat = std::make_shared<FourierMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "bsdffile") {
        mat->fileName = in->getParamString(name);
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled fourier-material parameter '"+it.first+"'");
    };
    return mat;
  }